

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O2

void run_andnot_test(void)

{
  short sVar1;
  _Bool _Var2;
  uint16_t uVar3;
  array_container_t *src_1;
  array_container_t *src_2;
  array_container_t *src_2_00;
  array_container_t *src_1_00;
  array_container_t *dst;
  bitset_container_t *src_2_01;
  bitset_container_t *src_2_02;
  bitset_container_t *src_2_03;
  bitset_container_t *src_1_01;
  bitset_container_t *bitset;
  run_container_t *src_1_02;
  run_container_t *src_2_04;
  run_container_t *src_2_05;
  run_container_t *src_1_03;
  unsigned_long uVar4;
  array_container_t *src_1_04;
  run_container_t *src_1_05;
  run_container_t *src_1_06;
  array_container_t *arr;
  int i;
  uint uVar5;
  ulong uVar6;
  int x;
  int iVar7;
  container_t *BM_1;
  bitset_container_t *local_38;
  
  src_1 = array_container_create();
  src_2 = array_container_create();
  src_2_00 = array_container_create();
  src_1_00 = array_container_create();
  dst = array_container_create();
  src_2_01 = bitset_container_create();
  src_2_02 = bitset_container_create();
  src_2_03 = bitset_container_create();
  src_1_01 = bitset_container_create();
  bitset = bitset_container_create();
  src_1_02 = run_container_create();
  src_2_04 = run_container_create();
  src_2_05 = run_container_create();
  src_1_03 = run_container_create();
  for (uVar5 = 0; uVar5 != 0x10000; uVar5 = uVar5 + 1) {
    uVar3 = (uint16_t)uVar5;
    if ((ushort)((short)((uVar5 & 0xffff) / 5) * -5 + uVar3) < 3) {
      array_container_add(src_1,uVar3);
      bitset_container_set(src_2_01,uVar3);
      run_container_add(src_1_02,uVar3);
    }
  }
  for (uVar5 = 0; uVar5 != 0x10000; uVar5 = uVar5 + 1) {
    uVar3 = (uint16_t)uVar5;
    if ((ushort)((short)((uVar5 & 0xffff) / 0x3e) * -0x3e + uVar3) < 0x25) {
      array_container_add(src_2,uVar3);
      bitset_container_set(src_2_02,uVar3);
      run_container_add(src_2_04,uVar3);
    }
  }
  uVar5 = 0;
  while( true ) {
    uVar3 = (uint16_t)uVar5;
    if (uVar5 == 0x10000) break;
    if (((ushort)((short)((uVar5 & 0xffff) / 5) * -5 + uVar3) < 3) &&
       (0x24 < (ushort)((short)((uVar5 & 0xffff) / 0x3e) * -0x3e + uVar3))) {
      array_container_add(dst,uVar3);
      bitset_container_set(bitset,uVar3);
    }
    uVar5 = uVar5 + 1;
  }
  uVar5 = 0;
  while( true ) {
    uVar3 = (uint16_t)uVar5;
    if (uVar5 == 0x10000) break;
    sVar1 = (short)((uVar5 & 0xffff) / 5) * -5;
    if (((ushort)(uVar3 + sVar1) < 2) || ((10000 < uVar5 && ((uint16_t)(sVar1 + uVar3) == 2)))) {
      array_container_add(src_2_00,uVar3);
      bitset_container_set(src_2_03,uVar3);
      run_container_add(src_2_05,uVar3);
    }
    uVar5 = uVar5 + 1;
  }
  uVar6 = 1;
  for (iVar7 = 0; iVar7 != 0x10000; iVar7 = iVar7 + 1) {
    if ((uVar6 & 3) != 0) {
      uVar3 = (uint16_t)iVar7;
      run_container_add(src_1_03,uVar3);
      array_container_add(src_1_00,uVar3);
      bitset_container_add(src_1_01,uVar3);
    }
    uVar6 = (ulong)((int)uVar6 * 0xd68 + 0x1a85) % 0x26f5;
  }
  uVar4 = (unsigned_long)dst->cardinality;
  BM_1 = (container_t *)0x0;
  _Var2 = run_bitset_container_andnot(src_1_02,src_2_01,&BM_1);
  _assert_true((ulong)!_Var2,"run_bitset_container_andnot(R1, B1, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x2dd);
  _assert_int_equal(0,(long)*BM_1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2de);
  array_container_free((array_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  array_run_container_andnot(src_1,src_1_02,dst);
  _assert_int_equal(0,(long)dst->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2e3);
  iVar7 = run_run_container_andnot(src_1_02,src_1_02,&BM_1);
  _assert_int_equal(3,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2e8);
  iVar7 = run_container_cardinality((run_container_t *)BM_1);
  _assert_int_equal(0,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2e9);
  run_container_free((run_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  _Var2 = run_bitset_container_andnot(src_1_02,src_2_03,&BM_1);
  _assert_true((ulong)!_Var2,"run_bitset_container_andnot(R1, B3, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x2ed);
  _assert_int_equal(2000,(long)*BM_1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2ee);
  array_container_free((array_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  local_38 = src_2_01;
  _Var2 = bitset_run_container_andnot(src_2_01,src_2_05,&BM_1);
  _assert_true((ulong)!_Var2,"bitset_run_container_andnot(B1, R3, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x2f2);
  _assert_int_equal(2000,(long)*BM_1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2f3);
  array_container_free((array_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  array_run_container_andnot(src_1,src_2_05,dst);
  _assert_int_equal(2000,(long)dst->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2f8);
  iVar7 = run_array_container_andnot(src_1_02,src_2_00,&BM_1);
  _assert_int_equal(2,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2fb);
  _assert_int_equal(2000,(long)*BM_1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2fc);
  array_container_free((array_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  iVar7 = run_run_container_andnot(src_1_02,src_2_05,&BM_1);
  _assert_int_equal(2,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x301);
  _assert_int_equal(2000,(long)*BM_1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x302);
  array_container_free((array_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  _Var2 = run_bitset_container_andnot(src_1_02,src_2_02,&BM_1);
  _assert_true((ulong)_Var2,"run_bitset_container_andnot(R1, B2, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x306);
  _assert_int_equal(uVar4,(long)*BM_1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x307);
  bitset_container_free((bitset_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  array_run_container_andnot(src_1,src_2_04,dst);
  _assert_int_equal(uVar4,(long)dst->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x30c);
  src_1_04 = array_container_create();
  for (iVar7 = -10; iVar7 != 0; iVar7 = iVar7 + 1) {
    array_container_add(src_1_04,(short)iVar7 + 1000);
  }
  src_1_05 = run_container_create();
  for (iVar7 = -10; iVar7 != 0; iVar7 = iVar7 + 1) {
    run_container_add(src_1_05,(short)iVar7 + 1000);
  }
  array_run_container_andnot(src_1_04,src_2_04,dst);
  _assert_int_equal(2,(long)dst->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x316);
  _Var2 = run_bitset_container_andnot(src_1_05,src_2_02,&BM_1);
  _assert_true((ulong)!_Var2,"run_bitset_container_andnot(R_small, B2, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x318);
  _assert_int_equal(2,(long)*BM_1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x319);
  array_container_free((array_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  iVar7 = run_array_container_andnot(src_1_05,src_2,&BM_1);
  _assert_int_equal(3,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,799);
  iVar7 = run_container_cardinality((run_container_t *)BM_1);
  _assert_int_equal(2,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,800);
  run_container_free((run_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  src_1_06 = run_container_create();
  arr = array_container_create();
  for (iVar7 = 0; iVar7 != 3; iVar7 = iVar7 + 1) {
    run_container_add(src_1_06,(uint16_t)iVar7);
  }
  for (iVar7 = -2; iVar7 != 0; iVar7 = iVar7 + 1) {
    run_container_add(src_1_06,(short)iVar7 + 0xc);
  }
  for (iVar7 = -5; iVar7 != 0; iVar7 = iVar7 + 1) {
    run_container_add(src_1_06,(short)iVar7 + 0x3e3);
  }
  for (iVar7 = -3; iVar7 != 0; iVar7 = iVar7 + 1) {
    run_container_add(src_1_06,(short)iVar7 + 0x2713);
  }
  for (iVar7 = -2; iVar7 != 0; iVar7 = iVar7 + 1) {
    run_container_add(src_1_06,(short)iVar7 + 0x4e22);
  }
  array_container_add(arr,0x3e1);
  array_container_add(arr,0x3e2);
  array_container_add(arr,2000);
  iVar7 = run_array_container_andnot(src_1_06,arr,&BM_1);
  _assert_int_equal(3,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x333);
  iVar7 = run_container_cardinality((run_container_t *)BM_1);
  _assert_int_equal(0xd,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x334);
  array_container_free((array_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  array_container_free(arr);
  run_container_free(src_1_06);
  iVar7 = run_array_container_andnot(src_1_02,src_2_00,&BM_1);
  _assert_int_equal(2,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x33c);
  _assert_int_equal(2000,(long)*BM_1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x33d);
  array_container_free((array_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  iVar7 = run_run_container_andnot(src_1_02,src_2_04,&BM_1);
  _assert_int_equal(1,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x342);
  _assert_int_equal(uVar4,(long)*BM_1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x343);
  bitset_container_free((bitset_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  _Var2 = bitset_bitset_container_andnot(src_1_01,src_2_03,&BM_1);
  _assert_true((ulong)_Var2,"bitset_bitset_container_andnot(B4, B3, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x349);
  uVar4 = (unsigned_long)*BM_1;
  bitset_container_free((bitset_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  _Var2 = run_bitset_container_andnot(src_1_03,src_2_03,&BM_1);
  _assert_true((ulong)_Var2,"run_bitset_container_andnot(R4, B3, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x34e);
  _assert_int_equal(uVar4,(long)*BM_1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x34f);
  bitset_container_free((bitset_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  array_run_container_andnot(src_1_00,src_2_05,dst);
  _assert_int_equal(uVar4,(long)dst->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x355);
  iVar7 = run_run_container_andnot(src_1_03,src_2_05,&BM_1);
  _assert_int_equal(1,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x358);
  _assert_int_equal(uVar4,(long)*BM_1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x359);
  bitset_container_free((bitset_container_t *)BM_1);
  BM_1 = (container_t *)0x0;
  array_container_free(src_1);
  array_container_free(src_2);
  array_container_free(src_2_00);
  array_container_free(src_1_00);
  array_container_free(dst);
  array_container_free(src_1_04);
  bitset_container_free(local_38);
  bitset_container_free(src_2_02);
  bitset_container_free(src_2_03);
  bitset_container_free(src_1_01);
  bitset_container_free(bitset);
  run_container_free(src_1_02);
  run_container_free(src_2_04);
  run_container_free(src_2_05);
  run_container_free(src_1_03);
  run_container_free(src_1_05);
  return;
}

Assistant:

DEFINE_TEST(run_andnot_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* A3 = array_container_create();
    array_container_t* A4 = array_container_create();
    array_container_t* AM = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* B3 = bitset_container_create();
    bitset_container_t* B4 = bitset_container_create();
    bitset_container_t* BM = bitset_container_create();
    run_container_t* R1 = run_container_create();
    run_container_t* R2 = run_container_create();
    run_container_t* R3 = run_container_create();
    run_container_t* R4 = run_container_create();

    // B/A1 minus  R1 is empty (array or run, I guess)
    // B/A1 minus R2 is probably best left as runs
    // B/A3 minus R1 is best as an array.
    // B/A3 minus R4 is best as a bitmap

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x++) {
        if (x % 5 < 3) {
            array_container_add(A1, x);
            bitset_container_set(B1, x);
            run_container_add(R1, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 62 < 37) {
            array_container_add(A2, x);
            bitset_container_set(B2, x);
            run_container_add(R2, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 5 < 3) && !(x % 62 < 37)) {
            array_container_add(AM, x);
            bitset_container_set(BM, x);
        }

    // the elements x%5 == 2 differ for less than 10k, otherwise same)
    for (int x = 0; x < (1 << 16); x++) {
        if ((x % 5 < 2) || ((x % 5 < 3) && (x > 10000))) {
            array_container_add(A3, x);
            bitset_container_set(B3, x);
            run_container_add(R3, x);
        }
    }

    int randstate = 1;  // for Oakenfull RNG, hope LSBits are nice
    for (int x = 0; x < (1 << 16); x++) {
        if (randstate % 4) {
            run_container_add(R4, x);
            array_container_add(A4, x);
            bitset_container_add(B4, x);
        }
        randstate = (3432 * randstate + 6789) % 9973;
    }

    int cm12 = array_container_cardinality(AM);

    container_t* BM_1 = NULL;

    assert_false(run_bitset_container_andnot(R1, B1, &BM_1));
    assert_int_equal(0, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A1, R1, AM);
    assert_int_equal(0, array_container_cardinality(AM));

    // both run coding and array coding have same serialized size for
    // empty
    assert_int_equal(RUN_CONTAINER_TYPE,
                     run_run_container_andnot(R1, R1, &BM_1));
    assert_int_equal(0, run_container_cardinality(CAST_run(BM_1)));
    run_container_free(CAST_run(BM_1));
    BM_1 = NULL;

    assert_false(run_bitset_container_andnot(R1, B3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_false(bitset_run_container_andnot(B1, R3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A1, R3, AM);
    assert_int_equal(2000, array_container_cardinality(AM));

    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_andnot(R1, A3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_run_container_andnot(R1, R3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_true(run_bitset_container_andnot(R1, B2, &BM_1));
    assert_int_equal(cm12, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A1, R2, AM);
    assert_int_equal(cm12, array_container_cardinality(AM));

    array_container_t* A_small = array_container_create();
    for (int i = 990; i < 1000; ++i) array_container_add(A_small, i);

    run_container_t* R_small = run_container_create();
    for (int i = 990; i < 1000; ++i) run_container_add(R_small, i);

    array_run_container_andnot(A_small, R2, AM);
    assert_int_equal(2,                                 // something like that
                     array_container_cardinality(AM));  // hopefully right...

    assert_false(run_bitset_container_andnot(R_small, B2, &BM_1));
    assert_int_equal(2, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    // note, result is equally small as an array or a run
    assert_int_equal(RUN_CONTAINER_TYPE,
                     run_array_container_andnot(R_small, A2, &BM_1));
    assert_int_equal(2, run_container_cardinality(CAST_run(BM_1)));
    run_container_free(CAST_run(BM_1));
    BM_1 = NULL;

    // test with more complicated small run structure (to do)
    run_container_t* R_small_complex = run_container_create();
    array_container_t* temp_ac = array_container_create();

    for (int i = 0; i < 3; ++i) run_container_add(R_small_complex, i);
    for (int i = 10; i < 12; ++i) run_container_add(R_small_complex, i);
    for (int i = 990; i < 995; ++i) run_container_add(R_small_complex, i);
    for (int i = 10000; i < 10003; ++i) run_container_add(R_small_complex, i);
    for (int i = 20000; i < 20002; ++i) run_container_add(R_small_complex, i);

    array_container_add(temp_ac, 993);
    array_container_add(temp_ac, 994);
    array_container_add(temp_ac, 2000);

    assert_int_equal(RUN_CONTAINER_TYPE, run_array_container_andnot(
                                             R_small_complex, temp_ac, &BM_1));
    assert_int_equal(13, run_container_cardinality(CAST_run(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    array_container_free(temp_ac);
    run_container_free(R_small_complex);

    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_andnot(R1, A3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_andnot(R1, R2, &BM_1));
    assert_int_equal(cm12, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    // compute the true card for cont4 - cont3 assuming that
    // bitset-bitset implementation is known correct
    assert_true(bitset_bitset_container_andnot(B4, B3, &BM_1));
    int card_4_3 = bitset_container_cardinality(CAST_bitset(BM_1));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    assert_true(run_bitset_container_andnot(R4, B3, &BM_1));
    assert_int_equal(card_4_3, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A4, R3, AM);
    // if this fails, either this bitset is wrong or the previous one...
    assert_int_equal(card_4_3, array_container_cardinality(AM));

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_andnot(R4, R3, &BM_1));
    assert_int_equal(card_4_3, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    array_container_free(A1);
    array_container_free(A2);
    array_container_free(A3);
    array_container_free(A4);
    array_container_free(AM);
    array_container_free(A_small);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(B3);
    bitset_container_free(B4);
    bitset_container_free(BM);

    run_container_free(R1);
    run_container_free(R2);
    run_container_free(R3);
    run_container_free(R4);
    run_container_free(R_small);
}